

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetTextControlPrivate::dropEvent
          (QWidgetTextControlPrivate *this,QMimeData *mimeData,QPointF *pos,DropAction dropAction,
          QObject *source)

{
  QPointF *pos_00;
  undefined1 *puVar1;
  Data *pDVar2;
  char cVar3;
  bool bVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QTextCursor insertionCursor;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pos_00 = *(QPointF **)&this->field_0x8;
  QTextCursor::QTextCursor((QTextCursor *)&local_40);
  puVar1 = *(undefined1 **)&this->dndFeedbackCursor;
  *(undefined1 **)&this->dndFeedbackCursor = local_40;
  local_40 = puVar1;
  QTextCursor::~QTextCursor((QTextCursor *)&local_40);
  if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
    cVar3 = (**(code **)((long)pos_00->xp + 0xa0))(pos_00,mimeData);
    if (cVar3 != '\0') {
      QTextCursor::QTextCursor((QTextCursor *)&local_40);
      repaintOldAndNewSelection(this,(QTextCursor *)&local_40);
      QTextCursor::~QTextCursor((QTextCursor *)&local_40);
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QWidgetTextControl::cursorForPosition((QWidgetTextControl *)&local_40,pos_00);
      QTextCursor::beginEditBlock();
      if (dropAction == MoveAction) {
        pDVar2 = (this->contextWidget).wp.d;
        if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (this->contextWidget).wp.value;
        }
        if (pQVar5 == source) {
          QTextCursor::removeSelectedText();
        }
      }
      QTextCursor::operator=(&this->cursor,(QTextCursor *)&local_40);
      (**(code **)((long)pos_00->xp + 0xa8))(pos_00,mimeData);
      QTextCursor::endEditBlock();
      (**(code **)((long)pos_00->xp + 0x60))(pos_00);
      QTextCursor::~QTextCursor((QTextCursor *)&local_40);
      bVar4 = true;
      goto LAB_004c34aa;
    }
  }
  bVar4 = false;
LAB_004c34aa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::dropEvent(const QMimeData *mimeData, const QPointF &pos, Qt::DropAction dropAction, QObject *source)
{
    Q_Q(QWidgetTextControl);
    dndFeedbackCursor = QTextCursor();

    if (!(interactionFlags & Qt::TextEditable) || !q->canInsertFromMimeData(mimeData))
        return false;

    repaintSelection();

    QTextCursor insertionCursor = q->cursorForPosition(pos);
    insertionCursor.beginEditBlock();

    if (dropAction == Qt::MoveAction && source == contextWidget)
        cursor.removeSelectedText();

    cursor = insertionCursor;
    q->insertFromMimeData(mimeData);
    insertionCursor.endEditBlock();
    q->ensureCursorVisible();
    return true; // accept proposed action
}